

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Option<Catch::GroupInfo>::reset(Option<Catch::GroupInfo> *this)

{
  GroupInfo *pGVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pGVar1 = this->nullableValue;
  if (pGVar1 != (GroupInfo *)0x0) {
    pcVar2 = (pGVar1->name)._M_dataplus._M_p;
    paVar3 = &(pGVar1->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar3) {
      operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    }
  }
  this->nullableValue = (GroupInfo *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = nullptr;
        }